

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O1

int ImGuizmo::GetMoveType(vec_t *gizmoHitProportion)

{
  undefined1 auVar1 [16];
  int iVar2;
  ImGuiIO *pIVar3;
  int iVar4;
  float *pfVar5;
  undefined8 *puVar6;
  uint axisIndex;
  ulong uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  bool belowPlaneLimit;
  bool belowAxisLimit;
  vec_t dirPlaneY;
  vec_t dirPlaneX;
  vec_t direction [3];
  bool local_ae;
  bool local_ad;
  float local_ac;
  float local_a8;
  float local_a4;
  vec_t *local_a0;
  vec_t local_98;
  vec_t local_88;
  undefined1 local_78 [16];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pIVar3 = ImGui::GetIO();
  fVar11 = (pIVar3->MousePos).x;
  iVar2 = 0;
  if (((_DAT_00200274 <= fVar11) && (iVar2 = 0, fVar11 <= DAT_0020027c)) &&
     (fVar11 = (pIVar3->MousePos).y, iVar2 = 7, fVar11 < DAT_00200278 || DAT_00200280 < fVar11)) {
    iVar2 = 0;
  }
  local_68 = _DAT_0020007c;
  uStack_60 = _DAT_00200084;
  local_58 = _DAT_0020008c;
  uStack_50 = _DAT_00200094;
  local_48 = _DAT_0020009c;
  uStack_40 = _DAT_002000a4;
  if (iVar2 == 0) {
    axisIndex = 0;
    uVar7 = 2;
    puVar6 = &local_48;
    local_a0 = gizmoHitProportion;
    do {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = uVar7;
      pfVar5 = (float *)(puVar6 + (SUB168(auVar1 * ZEXT816(0xaaaaaaaaaaaaaaab),8) &
                                  0x1ffffffffffffffe) * -3);
      ComputeTripodAxisAndVisibility(axisIndex,&local_88,&local_98,&local_ad,&local_ae);
      vec_t::TransformVector(&local_88,(matrix_t *)&DAT_0020007c);
      vec_t::TransformVector(&local_98,(matrix_t *)&DAT_0020007c);
      fVar11 = *pfVar5;
      fVar10 = pfVar5[1];
      fVar12 = pfVar5[2];
      fVar9 = fVar12 * fVar12 + fVar11 * fVar11 + fVar10 * fVar10;
      if (fVar9 < 0.0) {
        local_ac = fVar10;
        local_a8 = pfVar5[3];
        local_a4 = fVar11;
        local_78 = ZEXT416((uint)fVar12);
        fVar9 = sqrtf(fVar9);
        fVar10 = local_ac;
        fVar11 = local_a4;
        fVar14 = local_a8;
        fVar12 = (float)local_78._0_4_;
      }
      else {
        fVar9 = SQRT(fVar9);
        fVar14 = pfVar5[3];
      }
      fVar9 = 1.0 / fVar9;
      fVar11 = fVar11 * fVar9;
      fVar10 = fVar10 * fVar9;
      fVar12 = fVar12 * fVar9;
      fVar13 = fVar12 * DAT_00200264 + fVar11 * DAT_0020025c + fVar10 * DAT_00200260;
      uVar8 = -(uint)(ABS(fVar13) < 1.1920929e-07);
      fVar10 = (float)(uVar8 & 0xbf800000 |
                      ~uVar8 & (uint)(-((fVar12 * DAT_00200254 +
                                        fVar11 * DAT_0020024c + fVar10 * DAT_00200250) -
                                       (fVar14 * fVar9 * DAT_002000b8 +
                                       fVar12 * DAT_002000b4 +
                                       fVar11 * DAT_002000ac + fVar10 * DAT_002000b0)) / fVar13));
      fVar11 = 1.0 / DAT_00200284;
      fVar12 = ((DAT_0020025c * fVar10 + DAT_0020024c) - DAT_002000ac) * fVar11;
      fVar9 = ((DAT_00200260 * fVar10 + DAT_00200250) - DAT_002000b0) * fVar11;
      fVar11 = fVar11 * ((fVar10 * DAT_00200264 + DAT_00200254) - DAT_002000b4);
      fVar10 = fVar11 * local_98.z + fVar12 * local_98.x + fVar9 * local_98.y;
      iVar4 = axisIndex + 1;
      if (local_ad == false) {
        iVar4 = 0;
      }
      if (fVar10 <= -0.1) {
        iVar4 = 0;
      }
      if (0.1 <= fVar10) {
        iVar4 = 0;
      }
      fVar11 = local_88.z * fVar11 + local_88.x * fVar12 + local_88.y * fVar9;
      if (fVar11 <= 0.1) {
        iVar4 = 0;
      }
      if (1.0 <= fVar11) {
        iVar4 = 0;
      }
      iVar2 = iVar4;
      if (local_ae != false) {
        iVar2 = axisIndex + 4;
      }
      if (fVar11 < 0.5) {
        iVar2 = iVar4;
      }
      if (0.8 < fVar11) {
        iVar2 = iVar4;
      }
      if (fVar10 < 0.5) {
        iVar2 = iVar4;
      }
      if (0.8 < fVar10) {
        iVar2 = iVar4;
      }
      if (local_a0 != (vec_t *)0x0) {
        local_a0->x = fVar11;
        local_a0->y = fVar10;
        local_a0->z = 0.0;
        local_a0->w = 0.0;
      }
      if (1 < axisIndex) {
        return iVar2;
      }
      puVar6 = puVar6 + 2;
      uVar7 = uVar7 + 1;
      axisIndex = axisIndex + 1;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

static int GetMoveType(vec_t *gizmoHitProportion)
   {
      ImGuiIO& io = ImGui::GetIO();
      int type = NONE;

      // screen
      if (io.MousePos.x >= gContext.mScreenSquareMin.x && io.MousePos.x <= gContext.mScreenSquareMax.x &&
         io.MousePos.y >= gContext.mScreenSquareMin.y && io.MousePos.y <= gContext.mScreenSquareMax.y)
         type = MOVE_SCREEN;

      const vec_t direction[3] = { gContext.mModel.v.right, gContext.mModel.v.up, gContext.mModel.v.dir };

      // compute
      for (unsigned int i = 0; i < 3 && type == NONE; i++)
      {
         vec_t dirPlaneX, dirPlaneY;
         bool belowAxisLimit, belowPlaneLimit;
         ComputeTripodAxisAndVisibility(i, dirPlaneX, dirPlaneY, belowAxisLimit, belowPlaneLimit);
         dirPlaneX.TransformVector(gContext.mModel);
         dirPlaneY.TransformVector(gContext.mModel);

         const int planNormal = (i + 2) % 3;

         const float len = IntersectRayPlane(gContext.mRayOrigin, gContext.mRayVector, BuildPlan(gContext.mModel.v.position, direction[planNormal]));
         vec_t posOnPlan = gContext.mRayOrigin + gContext.mRayVector * len;

         const float dx = dirPlaneX.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         const float dy = dirPlaneY.Dot3((posOnPlan - gContext.mModel.v.position) * (1.f / gContext.mScreenFactor));
         if (belowAxisLimit && dy > -0.1f && dy < 0.1f && dx > 0.1f  && dx < 1.f)
            type = MOVE_X + i;

         if (belowPlaneLimit && dx >= quadUV[0] && dx <= quadUV[4] && dy >= quadUV[1] && dy <= quadUV[3])
            type = MOVE_XY + i;

         if (gizmoHitProportion)
            *gizmoHitProportion = makeVect(dx, dy, 0.f);
      }
      return type;
   }